

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.cpp
# Opt level: O0

void __thiscall r_exec::HLPController::EEntry::EEntry(EEntry *this,_Fact *evidence,_Fact *payload)

{
  _Fact *payload_local;
  _Fact *evidence_local;
  EEntry *this_local;
  
  core::P<r_exec::_Fact>::P(&this->evidence,evidence);
  load_data(this,payload);
  return;
}

Assistant:

HLPController::EEntry::EEntry(_Fact *evidence, _Fact *payload): evidence(evidence)
{
    load_data(payload);
}